

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_context.h
# Opt level: O0

void __thiscall
google::protobuf::internal::ParseContext::
ParseContext<google::protobuf::io::ZeroCopyInputStream*&,int&>
          (ParseContext *this,int depth,bool aliasing,char **start,ZeroCopyInputStream **args,
          int *args_1)

{
  char *pcVar1;
  int *args_local_1;
  ZeroCopyInputStream **args_local;
  char **start_local;
  bool aliasing_local;
  int depth_local;
  ParseContext *this_local;
  
  EpsCopyInputStream::EpsCopyInputStream(&this->super_EpsCopyInputStream,aliasing);
  this->depth_ = depth;
  this->group_depth_ = -0x80000000;
  Data::Data(&this->data_);
  pcVar1 = EpsCopyInputStream::InitFrom(&this->super_EpsCopyInputStream,*args,*args_1);
  *start = pcVar1;
  return;
}

Assistant:

ParseContext(int depth, bool aliasing, const char** start, T&&... args)
      : EpsCopyInputStream(aliasing), depth_(depth) {
    *start = InitFrom(std::forward<T>(args)...);
  }